

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OddProcessCounts.c
# Opt level: O0

int OddProcessCountsTryCollectOptions(void)

{
  int iVar1;
  uint local_20;
  IceTInt result;
  IceTInt max_image_split;
  IceTInt magic_k;
  IceTInt num_proc;
  IceTInt rank;
  IceTInt si_strategy;
  
  icetGetIntegerv(0x25,&num_proc);
  if (num_proc == 0x7004) {
    icetGetIntegerv(2,&magic_k);
    icetGetIntegerv(3,&max_image_split);
    for (result = 2; result <= max_image_split; result = result << 1) {
      if (magic_k == 0) {
        printf("      Using magic k value of %d\n",(ulong)(uint)result);
      }
      icetStateSetInteger(0x40,result);
      for (local_20 = 0; (int)local_20 <= max_image_split; local_20 = result + local_20) {
        if (magic_k == 0) {
          printf("        Using image split of %d\n",(ulong)local_20);
        }
        icetStateSetInteger(0x41,local_20);
        iVar1 = OddProcessCountsTryFrame();
        if (iVar1 != 0) {
          return iVar1;
        }
      }
    }
    rank = 0;
  }
  else {
    rank = OddProcessCountsTryFrame();
  }
  return rank;
}

Assistant:

static int OddProcessCountsTryCollectOptions(void)
{
    IceTInt si_strategy;

    icetGetIntegerv(ICET_SINGLE_IMAGE_STRATEGY, &si_strategy);

    if (si_strategy == ICET_SINGLE_IMAGE_STRATEGY_RADIXK) {
        IceTInt rank;
        IceTInt num_proc;
        IceTInt magic_k;

        icetGetIntegerv(ICET_RANK, &rank);
        icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);

        for (magic_k = 2; magic_k <= num_proc; magic_k *= 2) {
            IceTInt max_image_split;

            if (rank == 0) {
                printf("      Using magic k value of %d\n", magic_k);
            }
            icetStateSetInteger(ICET_MAGIC_K, magic_k);

            for (max_image_split = 0;
                 max_image_split <= num_proc;
                 max_image_split += magic_k) {
                IceTInt result;

                if (rank == 0) {
                    printf("        Using image split of %d\n",
                           max_image_split);
                }
                icetStateSetInteger(ICET_MAX_IMAGE_SPLIT, max_image_split);

                result = OddProcessCountsTryFrame();
                if (result != TEST_PASSED) { return result; }
            }
        }

        return TEST_PASSED;
    } else {
        return OddProcessCountsTryFrame();
    }
}